

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O3

int mbedtls_des_self_test(int verbose)

{
  long lVar1;
  char *pcVar2;
  uchar (*pauVar3) [8];
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uchar buf [8];
  uint32_t sk [96];
  mbedtls_des_context ctx;
  mbedtls_des3_context ctx3;
  uchar local_3f0 [8];
  int local_3e4;
  ulong uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  mbedtls_des_context local_238;
  mbedtls_des3_context local_1b0;
  
  local_238.sk[0] = 0;
  local_238.sk[1] = 0;
  local_238.sk[2] = 0;
  local_238.sk[3] = 0;
  local_238.sk[4] = 0;
  local_238.sk[5] = 0;
  local_238.sk[6] = 0;
  local_238.sk[7] = 0;
  local_238.sk[8] = 0;
  local_238.sk[9] = 0;
  local_238.sk[10] = 0;
  local_238.sk[0xb] = 0;
  local_238.sk[0xc] = 0;
  local_238.sk[0xd] = 0;
  local_238.sk[0xe] = 0;
  local_238.sk[0xf] = 0;
  local_238.sk[0x10] = 0;
  local_238.sk[0x11] = 0;
  local_238.sk[0x12] = 0;
  local_238.sk[0x13] = 0;
  local_238.sk[0x14] = 0;
  local_238.sk[0x15] = 0;
  local_238.sk[0x16] = 0;
  local_238.sk[0x17] = 0;
  local_238.sk[0x18] = 0;
  local_238.sk[0x19] = 0;
  local_238.sk[0x1a] = 0;
  local_238.sk[0x1b] = 0;
  local_238.sk[0x1c] = 0;
  local_238.sk[0x1d] = 0;
  local_238.sk[0x1e] = 0;
  local_238.sk[0x1f] = 0;
  memset(&local_1b0,0,0x180);
  uVar6 = 0;
  local_3e4 = verbose;
  do {
    while( true ) {
      if (verbose != 0) {
        uVar5 = 0x33;
        if (uVar6 < 2) {
          uVar5 = 0x20;
        }
        pcVar2 = "enc";
        if ((uVar6 & 1) == 0) {
          pcVar2 = "dec";
        }
        printf("  DES%c-ECB-%3d (%s): ",uVar5,(ulong)((uVar6 >> 1) * 0x38 + 0x38),pcVar2);
      }
      builtin_memcpy(local_3f0,"Now is t",8);
      mbedtls_des_setkey_dec(&local_238,des3_test_keys);
      iVar4 = 10000;
      do {
        if (uVar6 < 2) {
          mbedtls_des_crypt_ecb(&local_238,local_3f0,local_3f0);
        }
        else {
          mbedtls_des3_crypt_ecb(&local_1b0,local_3f0,local_3f0);
        }
        verbose = local_3e4;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      if ((uVar6 & 1) == 0) {
        pauVar3 = des3_test_ecb_dec;
      }
      else {
        pauVar3 = des3_test_ecb_enc;
      }
      if (local_3f0 != pauVar3[uVar6 >> 1]) goto LAB_00109101;
      if (local_3e4 == 0) break;
      puts("passed");
      uVar6 = uVar6 + 1;
      if (uVar6 == 6) {
        putchar(10);
        goto LAB_00108ea5;
      }
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 6);
LAB_00108ea5:
  uVar6 = 0;
  do {
    while( true ) {
      if (verbose != 0) {
        uVar5 = 0x33;
        if (uVar6 < 2) {
          uVar5 = 0x20;
        }
        pcVar2 = "enc";
        if ((uVar6 & 1) == 0) {
          pcVar2 = "dec";
        }
        printf("  DES%c-CBC-%3d (%s): ",uVar5,(ulong)((uVar6 >> 1) * 0x38 + 0x38),pcVar2);
      }
      builtin_memcpy(local_3f0,"Now is t",8);
      uStack_3e0 = (ulong)(uVar6 >> 1);
      mbedtls_des_setkey_dec(&local_238,des3_test_keys);
      iVar4 = 10000;
      uVar7 = 0x78563412;
      uVar8 = 0xefcdab90;
      uVar9 = 0;
      uVar10 = 0;
      do {
        uStack_3d8._0_1_ = local_3f0[0];
        uStack_3d8._1_1_ = local_3f0[1];
        uStack_3d8._2_1_ = local_3f0[2];
        uStack_3d8._3_1_ = local_3f0[3];
        uStack_3d8._4_1_ = local_3f0[4];
        uStack_3d8._5_1_ = local_3f0[5];
        uStack_3d8._6_1_ = local_3f0[6];
        uStack_3d8._7_1_ = local_3f0[7];
        uStack_3d0 = 0;
        uStack_3c8 = uVar7;
        uStack_3c4 = uVar8;
        uStack_3c0 = uVar9;
        uStack_3bc = uVar10;
        if (uVar6 < 2) {
          mbedtls_des_crypt_ecb(&local_238,local_3f0,local_3f0);
        }
        else {
          mbedtls_des3_crypt_ecb(&local_1b0,local_3f0,local_3f0);
        }
        uVar7 = local_3f0._0_4_ ^ uStack_3c8;
        uVar8 = local_3f0._4_4_ ^ uStack_3c4;
        local_3f0[4] = (char)uVar8;
        local_3f0[5] = (char)(uVar8 >> 8);
        local_3f0[6] = (char)(uVar8 >> 0x10);
        local_3f0[7] = (char)(uVar8 >> 0x18);
        local_3f0[0] = (char)uVar7;
        local_3f0[1] = (char)(uVar7 >> 8);
        local_3f0[2] = (char)(uVar7 >> 0x10);
        local_3f0[3] = (char)(uVar7 >> 0x18);
        iVar4 = iVar4 + -1;
        uVar7 = (uint)uStack_3d8;
        uVar8 = uStack_3d8._4_4_;
        uVar9 = (undefined4)uStack_3d0;
        uVar10 = uStack_3d0._4_4_;
      } while (iVar4 != 0);
      if (local_3f0 != des3_test_cbc_dec[uStack_3e0]) goto LAB_00109101;
      if (verbose != 0) break;
      uVar6 = uVar6 + 1;
      if (uVar6 == 6) goto LAB_00109122;
    }
    puts("passed");
    uVar6 = uVar6 + 1;
  } while (uVar6 != 6);
  putchar(10);
LAB_00109122:
  iVar4 = 0;
LAB_00109124:
  lVar1 = 0;
  do {
    *(undefined1 *)((long)local_238.sk + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x80);
  lVar1 = 0;
  do {
    *(undefined1 *)((long)local_1b0.sk + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x180);
  return iVar4;
LAB_00109101:
  iVar4 = 1;
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00109124;
}

Assistant:

int mbedtls_des_self_test( int verbose )
{
    int i, j, u, v, ret = 0;
    mbedtls_des_context ctx;
    mbedtls_des3_context ctx3;
    unsigned char buf[8];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[8];
    unsigned char iv[8];
#endif

    mbedtls_des_init( &ctx );
    mbedtls_des3_init( &ctx3 );
    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-ECB-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        for( j = 0; j < 10000; j++ )
        {
            if( u == 0 )
                mbedtls_des_crypt_ecb( &ctx, buf, buf );
            else
                mbedtls_des3_crypt_ecb( &ctx3, buf, buf );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_ecb_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  DES%c-CBC-%3d (%s): ",
                             ( u == 0 ) ? ' ' : '3', 56 + u * 56,
                             ( v == MBEDTLS_DES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  des3_test_iv,  8 );
        memcpy( prv, des3_test_iv,  8 );
        memcpy( buf, des3_test_buf, 8 );

        switch( i )
        {
        case 0:
            mbedtls_des_setkey_dec( &ctx, des3_test_keys );
            break;

        case 1:
            mbedtls_des_setkey_enc( &ctx, des3_test_keys );
            break;

        case 2:
            mbedtls_des3_set2key_dec( &ctx3, des3_test_keys );
            break;

        case 3:
            mbedtls_des3_set2key_enc( &ctx3, des3_test_keys );
            break;

        case 4:
            mbedtls_des3_set3key_dec( &ctx3, des3_test_keys );
            break;

        case 5:
            mbedtls_des3_set3key_enc( &ctx3, des3_test_keys );
            break;

        default:
            return( 1 );
        }

        if( v == MBEDTLS_DES_DECRYPT )
        {
            for( j = 0; j < 10000; j++ )
            {
                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );
            }
        }
        else
        {
            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[8];

                if( u == 0 )
                    mbedtls_des_crypt_cbc( &ctx, v, 8, iv, buf, buf );
                else
                    mbedtls_des3_crypt_cbc( &ctx3, v, 8, iv, buf, buf );

                memcpy( tmp, prv, 8 );
                memcpy( prv, buf, 8 );
                memcpy( buf, tmp, 8 );
            }

            memcpy( buf, prv, 8 );
        }

        if( ( v == MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_dec[u], 8 ) != 0 ) ||
            ( v != MBEDTLS_DES_DECRYPT &&
                memcmp( buf, des3_test_cbc_enc[u], 8 ) != 0 ) )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_des_free( &ctx );
    mbedtls_des3_free( &ctx3 );

    return( ret );
}